

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteProcessedMakefile(cmLocalNinjaGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar2 = std::operator<<(local_18,"# Write statements declared in CMakeLists.txt:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"# ");
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_CURRENT_LIST_FILE",&local_39);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_38);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    poVar2 = std::operator<<(local_18,"# Which is the root file.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  cmGlobalNinjaGenerator::WriteDivider(local_18);
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProcessedMakefile(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Write statements declared in CMakeLists.txt:" << std::endl
     << "# " << this->Makefile->GetDefinition("CMAKE_CURRENT_LIST_FILE")
     << std::endl;
  if (this->IsRootMakefile()) {
    os << "# Which is the root file." << std::endl;
  }
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << std::endl;
}